

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSFFile.cpp
# Opt level: O1

bool PSFFile::save(string *filename,uint8_t version,uint8_t *reserved,uint32_t reserved_size,
                  uint8_t *compressed_exe,uint32_t compressed_exe_size,
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *tags)

{
  char cVar1;
  int iVar2;
  FILE *__s;
  size_t sVar3;
  _Rb_tree_header *p_Var4;
  istream *piVar5;
  _Rb_tree_node_base *p_Var6;
  string line;
  istringstream value_reader;
  uint32_t local_1dc;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  _Rb_tree_node_base *local_1b8;
  long local_1b0 [15];
  ios_base local_138 [264];
  
  __s = fopen((filename->_M_dataplus)._M_p,"wb");
  if (__s != (FILE *)0x0) {
    sVar3 = fwrite("PSF",1,3,__s);
    if ((((sVar3 == 3) && (iVar2 = fputc((uint)version,__s), iVar2 != -1)) &&
        (local_1dc = reserved_size, sVar3 = fwrite(&local_1dc,1,4,__s), sVar3 == 4)) &&
       (local_1dc = compressed_exe_size, sVar3 = fwrite(&local_1dc,1,4,__s), sVar3 == 4)) {
      if (compressed_exe == (uint8_t *)0x0) {
        local_1dc = 0;
      }
      else {
        local_1dc = crc32(0,compressed_exe,compressed_exe_size);
      }
      sVar3 = fwrite(&local_1dc,1,4,__s);
      if (((sVar3 == 4) &&
          ((reserved_size == 0 || reserved == (uint8_t *)0x0 ||
           (sVar3 = fwrite(reserved,1,(ulong)reserved_size,__s), sVar3 == reserved_size)))) &&
         ((compressed_exe_size == 0 || compressed_exe == (uint8_t *)0x0 ||
          (sVar3 = fwrite(compressed_exe,1,(ulong)compressed_exe_size,__s),
          sVar3 == compressed_exe_size)))) {
        if ((tags->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00106260:
          fclose(__s);
          return true;
        }
        sVar3 = fwrite("[TAG]",1,5,__s);
        if (sVar3 == 5) {
          p_Var6 = (tags->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var4 = &(tags->_M_t)._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var6 != p_Var4) {
            local_1b8 = &p_Var4->_M_header;
            do {
              std::__cxx11::istringstream::istringstream
                        ((istringstream *)local_1b0,(string *)(p_Var6 + 2),_S_in);
              local_1d0 = 0;
              local_1c8 = 0;
              local_1d8 = &local_1c8;
              while( true ) {
                cVar1 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) +
                                        (char)(istringstream *)local_1b0);
                piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                   ((istream *)local_1b0,(string *)&local_1d8,cVar1);
                if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
                iVar2 = fprintf(__s,"%s=%s\n",*(undefined8 *)(p_Var6 + 1),local_1d8);
                if (iVar2 < 0) {
                  fclose(__s);
                  if (local_1d8 != &local_1c8) {
                    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
                  }
                  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
                  std::ios_base::~ios_base(local_138);
                  return false;
                }
              }
              if (local_1d8 != &local_1c8) {
                operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
              }
              std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
              std::ios_base::~ios_base(local_138);
              p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
            } while (p_Var6 != local_1b8);
          }
          goto LAB_00106260;
        }
      }
    }
    fclose(__s);
  }
  return false;
}

Assistant:

bool PSFFile::save(const std::string& filename, uint8_t version, const uint8_t * reserved, uint32_t reserved_size, const uint8_t * compressed_exe, uint32_t compressed_exe_size, std::map<std::string, std::string> tags)
{
	uint8_t data[4];

	FILE * fp = fopen(filename.c_str(), "wb");
	if (fp == NULL)
	{
		return false;
	}

	// signature
	if (fwrite(PSF_SIGNATURE, 1, PSF_SIGNATURE_SIZE, fp) != PSF_SIGNATURE_SIZE)
	{
		fclose(fp);
		return false;
	}

	// version
	if (fputc(version, fp) == EOF)
	{
		fclose(fp);
		return false;
	}

	// size of reserved area
	data[0] = reserved_size & 0xff;
	data[1] = (reserved_size >> 8) & 0xff;
	data[2] = (reserved_size >> 16) & 0xff;
	data[3] = (reserved_size >> 24) & 0xff;
	if (fwrite(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return false;
	}

	// size of program area
	data[0] = compressed_exe_size & 0xff;
	data[1] = (compressed_exe_size >> 8) & 0xff;
	data[2] = (compressed_exe_size >> 16) & 0xff;
	data[3] = (compressed_exe_size >> 24) & 0xff;
	if (fwrite(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return false;
	}

	// crc32 of program area
	uint32_t exe_crc = (compressed_exe != NULL) ? crc32(0L, compressed_exe, compressed_exe_size) : 0;
	data[0] = exe_crc & 0xff;
	data[1] = (exe_crc >> 8) & 0xff;
	data[2] = (exe_crc >> 16) & 0xff;
	data[3] = (exe_crc >> 24) & 0xff;
	if (fwrite(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return false;
	}

	// reserved area
	if (reserved != NULL && reserved_size != 0)
	{
		if (fwrite(reserved, 1, reserved_size, fp) != reserved_size)
		{
			fclose(fp);
			return false;
		}
	}

	// program area
	if (compressed_exe != NULL && compressed_exe_size != 0)
	{
		if (fwrite(compressed_exe, 1, compressed_exe_size, fp) != compressed_exe_size)
		{
			fclose(fp);
			return false;
		}
	}

	// tags
	if (!tags.empty())
	{
		if (fwrite(PSF_TAG_MARKER, 1, PSF_TAG_MARKER_SIZE, fp) != PSF_TAG_MARKER_SIZE)
		{
			fclose(fp);
			return false;
		}

		for (std::map<std::string, std::string>::iterator it = tags.begin(); it != tags.end(); ++it)
		{
			const std::string& key = it->first;
			const std::string& value = it->second;
			std::istringstream value_reader(value);
			std::string line;

			// process for each lines
			while (std::getline(value_reader, line))
			{
				if (fprintf(fp, "%s=%s\n", key.c_str(), line.c_str()) < 0)
				{
					fclose(fp);
					return false;
				}
			}
		}
	}

	fclose(fp);
	return true;
}